

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemFilter.h
# Opt level: O0

void __thiscall Assimp::FileSystemFilter::Cleanup(FileSystemFilter *this,string *in)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  uint8_t uVar5;
  int iVar6;
  ulong uVar7;
  reference pcVar8;
  difference_type dVar9;
  uint8_t *puVar10;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  undefined8 local_b0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  undefined8 local_a0;
  char *local_98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  undefined8 local_88;
  char *local_80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  char *local_68;
  char local_59;
  undefined8 uStack_58;
  char separator;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined8 local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined8 local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  iterator it;
  char last;
  string *in_local;
  FileSystemFilter *this_local;
  
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    it._M_current._7_1_ = '\0';
    local_28._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      pcVar8 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_28);
      bVar3 = IsSpaceOrNewLine<char>(*pcVar8);
      if (!bVar3) break;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_28);
    }
    local_30._M_current = (char *)std::__cxx11::string::begin();
    bVar3 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (bVar3) {
      local_40._M_current = (char *)std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_38,&local_40);
      local_50 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_28,1);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_48,&local_50);
      uStack_58 = std::__cxx11::string::erase(in,local_38,local_48);
    }
    iVar6 = (*(this->super_IOSystem)._vptr_IOSystem[3])();
    local_59 = (char)iVar6;
    local_68 = (char *)std::__cxx11::string::begin();
    local_28._M_current = local_68;
    while( true ) {
      local_70._M_current = (char *)std::__cxx11::string::end();
      bVar3 = __gnu_cxx::operator!=(&local_28,&local_70);
      if (!bVar3) break;
      pcVar8 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_28);
      iVar6 = strncmp(pcVar8,"://",3);
      if (iVar6 == 0) {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator+=(&local_28,3);
      }
      else {
        local_78._M_current = (char *)std::__cxx11::string::begin();
        bVar4 = __gnu_cxx::operator==(&local_28,&local_78);
        bVar3 = false;
        if (bVar4) {
          pcVar8 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_28);
          iVar6 = strncmp(pcVar8,"\\\\",2);
          bVar3 = iVar6 == 0;
        }
        if (bVar3) {
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator+=(&local_28,2);
        }
        else {
          pcVar8 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_28);
          if ((*pcVar8 == '/') ||
             (pcVar8 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_28), *pcVar8 == '\\')) {
            cVar1 = local_59;
            pcVar8 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_28);
            cVar2 = it._M_current._7_1_;
            *pcVar8 = cVar1;
            pcVar8 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_28);
            if (cVar2 == *pcVar8) {
              __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
              __normal_iterator<char*>
                        ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_88,&local_28)
              ;
              local_80 = (char *)std::__cxx11::string::erase(in,local_88);
              local_28._M_current = local_80;
              __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator--(&local_28);
            }
          }
          else {
            pcVar8 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_28);
            bVar3 = false;
            if (*pcVar8 == '%') {
              local_90._M_current = (char *)std::__cxx11::string::end();
              dVar9 = __gnu_cxx::operator-(&local_90,&local_28);
              bVar3 = 2 < dVar9;
            }
            if (bVar3) {
              pcVar8 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_28);
              bVar3 = IsHex(*pcVar8);
              if (bVar3) {
                pcVar8 = __gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_28);
                bVar3 = IsHex(pcVar8[1]);
                if (bVar3) {
                  pcVar8 = __gnu_cxx::
                           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&local_28);
                  uVar5 = HexOctetToDecimal(pcVar8);
                  puVar10 = (uint8_t *)
                            __gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&local_28);
                  *puVar10 = uVar5;
                  local_a8 = __gnu_cxx::
                             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator+(&local_28,1);
                  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                  __normal_iterator<char*>
                            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_a0,
                             &local_a8);
                  local_b8 = __gnu_cxx::
                             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator+(&local_28,2);
                  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                  __normal_iterator<char*>
                            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_b0,
                             &local_b8);
                  local_98 = (char *)std::__cxx11::string::erase(in,local_a0,local_b0);
                  local_28._M_current = local_98;
                  __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator--(&local_28);
                }
              }
            }
          }
          pcVar8 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_28);
          it._M_current._7_1_ = *pcVar8;
        }
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_28);
    }
  }
  return;
}

Assistant:

void Cleanup (std::string& in) const {
        if(in.empty()) {
            return;
        }

        // Remove a very common issue when we're parsing file names: spaces at the
        // beginning of the path.
        char last = 0;
        std::string::iterator it = in.begin();
        while (IsSpaceOrNewLine( *it ))++it;
        if (it != in.begin()) {
            in.erase(in.begin(),it+1);
        }

        const char separator = getOsSeparator();
        for (it = in.begin(); it != in.end(); ++it) {
            // Exclude :// and \\, which remain untouched.
            // https://sourceforge.net/tracker/?func=detail&aid=3031725&group_id=226462&atid=1067632
            if ( !strncmp(&*it, "://", 3 )) {
                it += 3;
                continue;
            }
            if (it == in.begin() && !strncmp(&*it, "\\\\", 2)) {
                it += 2;
                continue;
            }

            // Cleanup path delimiters
            if (*it == '/' || (*it) == '\\') {
                *it = separator;

                // And we're removing double delimiters, frequent issue with
                // incorrectly composited paths ...
                if (last == *it) {
                    it = in.erase(it);
                    --it;
                }
            } else if (*it == '%' && in.end() - it > 2) {
                // Hex sequence in URIs
                if( IsHex((&*it)[0]) && IsHex((&*it)[1]) ) {
                    *it = HexOctetToDecimal(&*it);
                    it = in.erase(it+1,it+2);
                    --it;
                }
            }

            last = *it;
        }
    }